

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O0

void update_aspa(aspa_table *s,aspa_record record,rtr_socket *rtr_sockt,
                aspa_operation_type operation_type)

{
  long lVar1;
  long in_FS_OFFSET;
  size_t count;
  size_t i;
  char c;
  socket_config *config;
  aspa_operation_type operation_type_local;
  rtr_socket *rtr_sockt_local;
  aspa_table *s_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((print_all_aspa_updates) || (((ulong)rtr_sockt[1].pfx_table & 0x1000000000000) != 0)) {
    pthread_mutex_lock((pthread_mutex_t *)&stdout_mutex);
    printf("HOST:  %s:%s\n",rtr_sockt[1].connection_state_fp,
           rtr_sockt[1].connection_state_fp_param_config);
    if (operation_type == ASPA_REMOVE) {
      i._7_1_ = '-';
    }
    else if (operation_type == ASPA_ADD) {
      i._7_1_ = '+';
    }
    else {
      i._7_1_ = '?';
    }
    printf("%c ASPA %u => [ ",(ulong)(uint)(int)i._7_1_,(ulong)record.customer_asn);
    for (count = 0; count < record.provider_count; count = count + 1) {
      printf("%u",(ulong)record.provider_asns[count]);
      if (count < record.provider_count - 1) {
        printf(", ");
      }
    }
    printf(" ]\n");
    pthread_mutex_unlock((pthread_mutex_t *)&stdout_mutex);
    free(record.provider_asns);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void update_aspa(struct aspa_table *s __attribute__((unused)), const struct aspa_record record,
			const struct rtr_socket *rtr_sockt, const enum aspa_operation_type operation_type)
{
	const struct socket_config *config = (const struct socket_config *)rtr_sockt;

	if (!print_all_aspa_updates && !config->print_aspa_updates)
		return;

	pthread_mutex_lock(&stdout_mutex);

	printf("HOST:  %s:%s\n", config->host, config->port);

	char c;

	switch (operation_type) {
	case ASPA_ADD:
		c = '+';
		break;
	case ASPA_REMOVE:
		c = '-';
		break;
	default:
		c = '?';
		break;
	}

	printf("%c ASPA %u => [ ", c, record.customer_asn);

	size_t i;
	size_t count = record.provider_count;

	for (i = 0; i < count; i++) {
		printf("%u", record.provider_asns[i]);
		if (i < count - 1)
			printf(", ");
	}

	printf(" ]\n");
	pthread_mutex_unlock(&stdout_mutex);
	free(record.provider_asns);
}